

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tipc_connecter.cpp
# Opt level: O1

void __thiscall zmq::tipc_connecter_t::start_connecting(tipc_connecter_t *this)

{
  io_object_t *this_00;
  socket_base_t *this_01;
  int iVar1;
  int *piVar2;
  handle_t pvVar3;
  int in_EDX;
  int __fd;
  char *in_RSI;
  endpoint_uri_pair_t local_58;
  
  iVar1 = open(this,in_RSI,in_EDX);
  __fd = (int)in_RSI;
  if (iVar1 == 0) {
    pvVar3 = io_object_t::add_fd(&(this->super_stream_connecter_base_t).super_io_object_t,
                                 (this->super_stream_connecter_base_t)._s);
    (this->super_stream_connecter_base_t)._handle = pvVar3;
    out_event(this);
    return;
  }
  piVar2 = __errno_location();
  if (*piVar2 == 0x73) {
    this_00 = &(this->super_stream_connecter_base_t).super_io_object_t;
    pvVar3 = io_object_t::add_fd(this_00,(this->super_stream_connecter_base_t)._s);
    (this->super_stream_connecter_base_t)._handle = pvVar3;
    io_object_t::set_pollout(this_00,pvVar3);
    this_01 = (this->super_stream_connecter_base_t)._socket;
    make_unconnected_connect_endpoint_pair
              (&local_58,&(this->super_stream_connecter_base_t)._endpoint);
    iVar1 = zmq_errno();
    socket_base_t::event_connect_delayed(this_01,&local_58,iVar1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.remote._M_dataplus._M_p != &local_58.remote.field_2) {
      operator_delete(local_58.remote._M_dataplus._M_p,
                      local_58.remote.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.local._M_dataplus._M_p != &local_58.local.field_2) {
      operator_delete(local_58.local._M_dataplus._M_p,
                      local_58.local.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  if ((this->super_stream_connecter_base_t)._s != -1) {
    stream_connecter_base_t::close(&this->super_stream_connecter_base_t,__fd);
  }
  stream_connecter_base_t::add_reconnect_timer(&this->super_stream_connecter_base_t);
  return;
}

Assistant:

void zmq::tipc_connecter_t::start_connecting ()
{
    //  Open the connecting socket.
    int rc = open ();

    //  Connect may succeed in synchronous manner.
    if (rc == 0) {
        _handle = add_fd (_s);
        out_event ();
    }

    //  Connection establishment may be delayed. Poll for its completion.
    else if (rc == -1 && errno == EINPROGRESS) {
        _handle = add_fd (_s);
        set_pollout (_handle);
        _socket->event_connect_delayed (
          make_unconnected_connect_endpoint_pair (_endpoint), zmq_errno ());
    }

    //  Handle any other error condition by eventual reconnect.
    else {
        if (_s != retired_fd)
            close ();
        add_reconnect_timer ();
    }
}